

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O3

HPDF_STATUS HPDF_Doc_SetCurrentPages(HPDF_Doc pdf,HPDF_Pages pages)

{
  HPDF_BOOL HVar1;
  HPDF_STATUS HVar2;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    HVar2 = 0x1025;
  }
  else {
    HVar1 = HPDF_Pages_Validate(pages);
    if ((HVar1 == 0) || (pdf->mmgr != pages->mmgr)) {
      HVar2 = HPDF_SetError(&pdf->error,0x1038,0);
      return HVar2;
    }
    pdf->cur_pages = pages;
    HVar2 = 0;
  }
  return HVar2;
}

Assistant:

HPDF_STATUS
HPDF_Doc_SetCurrentPages  (HPDF_Doc     pdf,
                           HPDF_Pages   pages)
{
    HPDF_PTRACE ((" HPDF_Doc_SetCurrentPages\n"));

    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    if (!HPDF_Pages_Validate (pages))
        return HPDF_SetError (&pdf->error, HPDF_INVALID_PAGES, 0);

    /* check whether the pages belong to the pdf */
    if (pdf->mmgr != pages->mmgr)
        return HPDF_SetError (&pdf->error, HPDF_INVALID_PAGES, 0);

    pdf->cur_pages = pages;

    return HPDF_OK;
}